

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O1

double __thiscall
Jupiter::IRC::Client::readConfigDouble(Client *this,string_view key,double defaultValue)

{
  const_iterator cVar1;
  double dVar2;
  string_view sVar3;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  if (this->m_primary_section != (Config *)0x0) {
    sVar3 = Config::get(this->m_primary_section,key,(string_view)ZEXT816(0));
    if (sVar3._M_len != 0) {
      dVar2 = Jupiter_strtod_s(sVar3._M_str,sVar3._M_len);
      return dVar2;
    }
  }
  if ((this->m_secondary_section != (Config *)0x0) &&
     (local_30._M_len = key._M_len, local_30._M_str = key._M_str,
     cVar1 = std::
             _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
             ::_M_find_tr<std::basic_string_view<char,std::char_traits<char>>,void,void>
                       ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                         *)&this->m_secondary_section->m_table,&local_30),
     cVar1.
     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
     ._M_cur != (__node_type *)0x0)) {
    defaultValue = Jupiter_strtod_s(*(char **)((long)cVar1.
                                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                                  ._M_cur + 0x28),
                                    *(size_t *)
                                     ((long)cVar1.
                                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                            ._M_cur + 0x30));
  }
  return defaultValue;
}

Assistant:

double Jupiter::IRC::Client::readConfigDouble(std::string_view key, double defaultValue) const {
	if (m_primary_section != nullptr) {
		std::string_view val = m_primary_section->get(key);

		if (!val.empty()) {
			return Jupiter::from_string<double>(val);
		}
	}

	if (m_secondary_section != nullptr) {
		return m_secondary_section->get<double>(key, defaultValue);
	}

	return defaultValue;
}